

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall gss::innards::Proof::recover_adjacency_lines(Proof *this,int g,int p,int n,int t)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  undefined1 auVar2 [16];
  iterator iVar3;
  ostream *poVar4;
  long lVar5;
  _Tuple_impl<0UL,_long,_long,_long,_long> local_38;
  
  auVar2 = vpinsrd_avx(ZEXT416((uint)t),n,1);
  auVar2 = vpinsrd_avx(auVar2,p,2);
  auVar2 = vpinsrd_avx(auVar2,g,3);
  local_38 = (_Tuple_impl<0UL,_long,_long,_long,_long>)vpmovsxdq_avx2(auVar2);
  iVar3 = std::
          _Rb_tree<std::tuple<long,_long,_long,_long>,_std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::find(&(((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  adjacency_lines)._M_t,(key_type *)&local_38);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  if ((iVar3._M_node != (_Base_ptr)((long)&(_Var1._M_head_impl)->adjacency_lines + 8U)) &&
     (*(long *)(iVar3._M_node + 3) == 0)) {
    std::operator<<((ostream *)((_Var1._M_head_impl)->proof_stream)._M_t,"# 0\n");
    poVar4 = std::operator<<((ostream *)
                             (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t,"red ");
    poVar4 = std::operator<<(poVar4,(string *)(iVar3._M_node + 2));
    std::operator<<(poVar4," ; ;\n");
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    lVar5 = (_Var1._M_head_impl)->proof_line + 1;
    (_Var1._M_head_impl)->proof_line = lVar5;
    *(long *)(iVar3._M_node + 3) = lVar5;
    poVar4 = std::operator<<((ostream *)((_Var1._M_head_impl)->proof_stream)._M_t,"# ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar4,
                        ((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        active_level);
    std::operator<<(poVar4,'\n');
  }
  return;
}

Assistant:

auto Proof::recover_adjacency_lines(int g, int p, int n, int t) -> void
{
    auto it = _imp->adjacency_lines.find(tuple{g, p, n, t});
    if (it != _imp->adjacency_lines.end() && 0 == get<1>(it->second)) {
        *_imp->proof_stream << "# 0\n";
        *_imp->proof_stream << "red " << get<2>(it->second) << " ; ;\n";
        get<1>(it->second) = ++_imp->proof_line;
        *_imp->proof_stream << "# " << _imp->active_level << '\n';
    }
}